

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O3

void emtres(emtcxdef *ctx,ushort bytes)

{
  ushort cliobj;
  ushort uVar1;
  mcmcxdef *cctx;
  uchar *puVar2;
  short sVar3;
  ushort newsize;
  
  cctx = ctx->emtcxmem;
  cliobj = ctx->emtcxobj;
  uVar1 = *(ushort *)
           ((long)&cctx->mcmcxgl->mcmcxtab[cctx->mcmcxmtb[cliobj >> 8][cliobj & 0xff] >> 8]->mcmosiz
           + (ulong)((cctx->mcmcxmtb[cliobj >> 8][cliobj & 0xff] & 0xff) << 5));
  sVar3 = bytes + ctx->emtcxofs;
  if (uVar1 < (ushort)(sVar3 + 1U)) {
    newsize = sVar3 + 0x101;
    if (newsize < uVar1) {
      errsigf(ctx->emtcxerr,"TADS",400);
    }
    puVar2 = mcmrealo(cctx,cliobj,newsize);
    ctx->emtcxptr = puVar2;
  }
  return;
}

Assistant:

void emtres(emtcxdef *ctx, ushort bytes)
{
    ushort oldsiz = mcmobjsiz(ctx->emtcxmem, ctx->emtcxobj);
    ushort need;
    
    need = ctx->emtcxofs + bytes + 1;
    
    if (need > oldsiz)
    {
        ushort newsiz;
        
        newsiz = need + EMTINC;
        if (newsiz < oldsiz) errsig(ctx->emtcxerr, ERR_OBJOVF);
        ctx->emtcxptr = mcmrealo(ctx->emtcxmem, ctx->emtcxobj, newsiz);
        assert(mcmobjsiz(ctx->emtcxmem, ctx->emtcxobj) >= need);
    }
}